

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O0

TestLog * glu::operator<<(TestLog *log,ProgramSources *sources)

{
  ulong uVar1;
  ProgramSources *this;
  qpShaderType type;
  size_type sVar2;
  const_reference source;
  allocator<char> local_f1;
  string local_f0;
  LogShader local_d0;
  ulong local_80;
  size_t shaderNdx;
  int shaderType;
  allocator<char> local_61;
  string local_60;
  LogShaderProgram local_40;
  ProgramSources *local_18;
  ProgramSources *sources_local;
  TestLog *log_local;
  
  local_18 = sources;
  sources_local = (ProgramSources *)log;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"(Source only)",&local_61);
  tcu::LogShaderProgram::LogShaderProgram(&local_40,false,&local_60);
  tcu::TestLog::operator<<(log,&local_40);
  tcu::LogShaderProgram::~LogShaderProgram(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  for (shaderNdx._0_4_ = SHADERTYPE_VERTEX; (int)(ShaderType)shaderNdx < 6;
      shaderNdx._0_4_ = (ShaderType)shaderNdx + SHADERTYPE_FRAGMENT) {
    local_80 = 0;
    while( true ) {
      uVar1 = local_80;
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_18->sources + (int)(ShaderType)shaderNdx);
      this = sources_local;
      if (sVar2 <= uVar1) break;
      type = getLogShaderType((ShaderType)shaderNdx);
      source = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_18->sources + (int)(ShaderType)shaderNdx,local_80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"",&local_f1);
      tcu::LogShader::LogShader(&local_d0,type,source,false,&local_f0);
      tcu::TestLog::operator<<((TestLog *)this,&local_d0);
      tcu::LogShader::~LogShader(&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
      local_80 = local_80 + 1;
    }
  }
  tcu::TestLog::operator<<
            ((TestLog *)sources_local,(EndShaderProgramToken *)&tcu::TestLog::EndShaderProgram);
  return (TestLog *)sources_local;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const ProgramSources& sources)
{
	log << tcu::TestLog::ShaderProgram(false, "(Source only)");

	try
	{
		for (int shaderType = 0; shaderType < SHADERTYPE_LAST; shaderType++)
		{
			for (size_t shaderNdx = 0; shaderNdx < sources.sources[shaderType].size(); shaderNdx++)
			{
				log << tcu::TestLog::Shader(getLogShaderType((ShaderType)shaderType),
											sources.sources[shaderType][shaderNdx],
											false, "");
			}
		}
	}
	catch (...)
	{
		log << tcu::TestLog::EndShaderProgram;
		throw;
	}

	log << tcu::TestLog::EndShaderProgram;

	return log;
}